

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label_histogram_converter_impl.h
# Opt level: O3

void __thiscall
label_histogram_converter::Converter<label::StringLabel>::create_label_histrogram
          (Converter<label::StringLabel> *this,Node<label::StringLabel> *tree_node,
          unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
          *label_histogram,int *tree_size)

{
  unordered_map<label::StringLabel,_int,_label_histogram_converter::Converter<label::StringLabel>::labelhash,_std::equal_to<label::StringLabel>,_std::allocator<std::pair<const_label::StringLabel,_int>_>_>
  *this_00;
  int iVar1;
  pointer pNVar2;
  pointer pcVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_> *__range2
  ;
  Node<label::StringLabel> *child;
  pointer tree_node_00;
  StringLabel key;
  string label_str;
  key_type local_70;
  long *local_50 [2];
  long local_40 [2];
  
  pNVar2 = (tree_node->children_).
           super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (tree_node_00 = (tree_node->children_).
                      super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; tree_node_00 != pNVar2;
      tree_node_00 = tree_node_00 + 1) {
    create_label_histrogram(this,tree_node_00,label_histogram,tree_size);
  }
  local_70.label_._M_dataplus._M_p = (pointer)&local_70.label_.field_2;
  pcVar3 = (tree_node->label_).label_._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar3,pcVar3 + (tree_node->label_).label_._M_string_length);
  pcVar3 = (tree_node->label_).label_._M_dataplus._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar3,pcVar3 + (tree_node->label_).label_._M_string_length);
  this_00 = &this->label_id_map_;
  iVar4 = std::
          _Hashtable<label::StringLabel,_std::pair<const_label::StringLabel,_int>,_std::allocator<std::pair<const_label::StringLabel,_int>_>,_std::__detail::_Select1st,_std::equal_to<label::StringLabel>,_label_histogram_converter::Converter<label::StringLabel>::labelhash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&this_00->_M_h,&local_70);
  if (iVar4.super__Node_iterator_base<std::pair<const_label::StringLabel,_int>,_true>._M_cur ==
      (__node_type *)0x0) {
    iVar1 = this->label_id_;
    this->label_id_ = iVar1 + 1;
    pmVar5 = std::__detail::
             _Map_base<label::StringLabel,_std::pair<const_label::StringLabel,_int>,_std::allocator<std::pair<const_label::StringLabel,_int>_>,_std::__detail::_Select1st,_std::equal_to<label::StringLabel>,_label_histogram_converter::Converter<label::StringLabel>::labelhash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<label::StringLabel,_std::pair<const_label::StringLabel,_int>,_std::allocator<std::pair<const_label::StringLabel,_int>_>,_std::__detail::_Select1st,_std::equal_to<label::StringLabel>,_label_histogram_converter::Converter<label::StringLabel>::labelhash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_00,&local_70);
    *pmVar5 = iVar1;
  }
  pmVar5 = std::__detail::
           _Map_base<label::StringLabel,_std::pair<const_label::StringLabel,_int>,_std::allocator<std::pair<const_label::StringLabel,_int>_>,_std::__detail::_Select1st,_std::equal_to<label::StringLabel>,_label_histogram_converter::Converter<label::StringLabel>::labelhash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<label::StringLabel,_std::pair<const_label::StringLabel,_int>,_std::allocator<std::pair<const_label::StringLabel,_int>_>,_std::__detail::_Select1st,_std::equal_to<label::StringLabel>,_label_histogram_converter::Converter<label::StringLabel>::labelhash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_00,&local_70);
  pmVar6 = std::__detail::
           _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)label_histogram,pmVar5);
  *pmVar6 = *pmVar6 + 1;
  *tree_size = *tree_size + 1;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.label_._M_dataplus._M_p != &local_70.label_.field_2) {
    operator_delete(local_70.label_._M_dataplus._M_p,
                    local_70.label_.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Converter<Label>::create_label_histrogram(
    const node::Node<Label>& tree_node, 
    std::unordered_map<int, int>& label_histogram, 
    int& tree_size) {

  // do recursively for all children
  for (const auto& child: tree_node.get_children()) {
    create_label_histrogram(child, label_histogram, tree_size);
  }

  Label key = tree_node.label();
  std::string label_str = tree_node.label().to_string();

  // lookup key in token_map
  typename std::unordered_map<Label, int, labelhash>::const_iterator 
                              label_in_map = label_id_map_.find(key);
  // if label not in map
  if(label_in_map == label_id_map_.end())
    // add label id to map
    label_id_map_[key] = label_id_++;

  // increase label count for current node
  ++label_histogram[label_id_map_[key]];
  // increase tree size
  ++tree_size;
}